

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form1_GetThreshold(GetThresholdForm1 GetThreshold)

{
  int *piVar1;
  byte bVar2;
  pointer puVar3;
  byte bVar4;
  void *__s;
  byte bVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  undefined1 local_68 [16];
  pointer local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  Unit_Test::intensityArray(&local_48,2);
  if (*local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start ==
      *(byte *)((long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1)) {
    do {
      Unit_Test::intensityArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,2)
      ;
      puVar3 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_58;
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
      local_68 = ZEXT816(0) << 0x20;
      local_58 = (pointer)0x0;
      if ((pointer)puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
      }
      if ((pointer)local_68._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_68._0_8_);
      }
    } while (*local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
             *(byte *)((long)local_48.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + 1));
  }
  local_68 = ZEXT816(0);
  local_58 = (pointer)0x0;
  __s = operator_new(0x400);
  local_68._8_8_ = __s;
  local_68._0_8_ = __s;
  local_58 = (pointer)((long)__s + 0x400);
  memset(__s,0,0x400);
  local_68._8_8_ = (pointer)((long)__s + 0x400);
  piVar1 = (int *)((long)__s +
                  (ulong)*local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start * 4);
  *piVar1 = *piVar1 + 1;
  piVar1 = (int *)((long)__s +
                  (ulong)*(byte *)((long)local_48.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1) * 4);
  *piVar1 = *piVar1 + 1;
  bVar4 = (*GetThreshold)((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
  bVar5 = *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar2 = *(byte *)((long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_);
  }
  if ((pointer)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar2 < bVar5) {
    bVar5 = bVar2;
  }
  return bVar4 == bVar5;
}

Assistant:

bool form1_GetThreshold(GetThresholdForm1 GetThreshold)
    {
        std::vector < uint8_t > intensity = intensityArray( 2 );
        while (intensity[0] == intensity[1])
            intensity = intensityArray( 2 );

        std::vector< uint32_t > histogram( 256u, 0);
        ++histogram[intensity[0]];
        ++histogram[intensity[1]];

        return GetThreshold(histogram) == std::min(intensity[0], intensity[1]);
    }